

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O2

void __thiscall vmips::Function::add_ret(Function *this)

{
  element_type *peVar1;
  int iVar2;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (add_ret()::ending == '\0') {
    iVar2 = __cxa_guard_acquire(&add_ret()::ending);
    if (iVar2 != 0) {
      std::__cxx11::string::string((string *)&local_70,"j ",&local_91);
      std::operator+(&local_50,&local_70,".L");
      std::operator+(&local_30,&local_50,&this->name);
      std::operator+(&local_90,&local_30,"_epilogue");
      std::make_shared<vmips::text,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &add_ret::ending);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      __cxa_atexit(std::__shared_ptr<vmips::text,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &add_ret::ending,&__dso_handle);
      __cxa_guard_release(&add_ret()::ending);
    }
  }
  peVar1 = (this->cursor).super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<vmips::text,void>
            ((__shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2> *)&local_90,
             &add_ret::ending.super___shared_ptr<vmips::text,_(__gnu_cxx::_Lock_policy)2>);
  std::
  vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>::
  emplace_back<std::shared_ptr<vmips::Instruction>>
            ((vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>
              *)&peVar1->instructions,(shared_ptr<vmips::Instruction> *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length);
  return;
}

Assistant:

void Function::add_ret() {
    static auto ending = std::make_shared<text>(std::string{"j "} + ".L" + this->name + "_epilogue");
    cursor->instructions.push_back(ending);
}